

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

Token __thiscall Lexer::ReadToken(Lexer *this)

{
  bool bVar1;
  Token unaff_EBX;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  
  pbVar3 = (byte *)this->ofs_;
  do {
    pbVar2 = pbVar3;
    bVar4 = *pbVar2;
    if (bVar4 == 0x20) {
      pbVar5 = pbVar2 + 1;
      do {
        pbVar3 = pbVar5;
        bVar4 = *pbVar3;
        pbVar5 = pbVar3 + 1;
      } while (bVar4 == 0x20);
      if (bVar4 < 0xd) {
        if (bVar4 == 10) {
LAB_0012338f:
          pbVar3 = pbVar3 + 1;
          bVar1 = true;
          unaff_EBX = NEWLINE;
        }
        else {
LAB_00123473:
          bVar1 = true;
          unaff_EBX = INDENT;
        }
      }
      else {
        if (bVar4 == 0xd) {
          bVar1 = false;
          if (*pbVar5 != 10) {
LAB_00123827:
            unaff_EBX = ERROR;
            if (!bVar1) {
              unaff_EBX = INDENT;
            }
LAB_00123832:
            bVar1 = true;
            goto LAB_00123835;
          }
LAB_0012352b:
          bVar1 = true;
          unaff_EBX = NEWLINE;
        }
        else {
          if (bVar4 != 0x23) goto LAB_00123473;
          bVar1 = false;
          pbVar5 = pbVar3;
          do {
            bVar4 = pbVar5[1];
            pbVar5 = pbVar5 + 1;
LAB_0012380d:
            if (bVar4 == 0) goto LAB_00123827;
          } while (bVar4 != 10);
          bVar1 = false;
        }
        pbVar3 = pbVar5 + 1;
      }
    }
    else {
      pbVar3 = pbVar2;
      if (bVar4 < 0x5f) {
        if (bVar4 < 0x2d) {
          if (bVar4 < 0xd) {
            if (bVar4 == 0) {
              pbVar3 = pbVar2 + 1;
              bVar1 = true;
              unaff_EBX = TEOF;
              goto LAB_00123835;
            }
            if (bVar4 == 10) goto LAB_0012338f;
          }
          else if (bVar4 == 0xd) {
            pbVar5 = pbVar2 + 1;
            if (pbVar2[1] == 10) goto LAB_0012352b;
          }
          else if (bVar4 == 0x23) {
            pbVar3 = pbVar2 + 1;
            bVar4 = pbVar2[1];
            bVar1 = true;
            pbVar5 = pbVar3;
            if (bVar4 != 0) goto LAB_0012380d;
          }
        }
        else if (bVar4 < 0x3b) {
          if (bVar4 != 0x2f) {
            if (bVar4 != 0x3a) goto LAB_001237ea;
            pbVar3 = pbVar2 + 1;
            bVar1 = true;
            unaff_EBX = COLON;
            goto LAB_00123835;
          }
        }
        else if (bVar4 < 0x3e) {
          if (bVar4 == 0x3d) {
            pbVar3 = pbVar2 + 1;
            bVar1 = true;
            unaff_EBX = EQUALS;
            goto LAB_00123835;
          }
        }
        else if ((byte)(bVar4 + 0xbf) < 0x1a) goto LAB_001237ea;
LAB_001236f2:
        pbVar3 = pbVar2 + 1;
        bVar1 = true;
        unaff_EBX = ERROR;
      }
      else {
        if (bVar4 < 0x6a) {
          if (bVar4 < 99) {
            if (bVar4 == 0x60) goto LAB_001236f2;
            if (bVar4 == 0x62) {
              bVar4 = pbVar2[1];
              if (bVar4 != 0x75) goto LAB_001237c0;
              bVar4 = pbVar2[2];
              if (bVar4 != 0x69) goto LAB_001237c6;
              bVar4 = pbVar2[3];
              if (bVar4 != 0x6c) goto LAB_001237cc;
              bVar4 = pbVar2[4];
              if (bVar4 != 100) goto LAB_001237d2;
              pbVar3 = pbVar2 + 5;
              if ((""[pbVar2[5]] & 0x40) == 0) {
                bVar1 = true;
                unaff_EBX = BUILD;
                goto LAB_00123835;
              }
            }
          }
          else if (bVar4 == 100) {
            bVar4 = pbVar2[1];
            if (bVar4 != 0x65) {
LAB_001237c0:
              pbVar3 = pbVar2 + 1;
              goto LAB_001237f1;
            }
            bVar4 = pbVar2[2];
            if (bVar4 != 0x66) {
LAB_001237c6:
              pbVar3 = pbVar2 + 2;
              goto LAB_001237f1;
            }
            bVar4 = pbVar2[3];
            if (bVar4 != 0x61) {
LAB_001237cc:
              pbVar3 = pbVar2 + 3;
              goto LAB_001237f1;
            }
            bVar4 = pbVar2[4];
            if (bVar4 != 0x75) {
LAB_001237d2:
              pbVar3 = pbVar2 + 4;
              goto LAB_001237f1;
            }
            bVar4 = pbVar2[5];
            if (bVar4 != 0x6c) {
LAB_001237d8:
              pbVar3 = pbVar2 + 5;
              goto LAB_001237f1;
            }
            bVar4 = pbVar2[6];
            if (bVar4 != 0x74) {
LAB_001237de:
              pbVar3 = pbVar2 + 6;
              goto LAB_001237f1;
            }
            pbVar3 = pbVar2 + 7;
            if ((""[pbVar2[7]] & 0x40) == 0) {
              bVar1 = true;
              unaff_EBX = DEFAULT;
              goto LAB_00123835;
            }
          }
          else if (bVar4 == 0x69) {
            bVar4 = pbVar2[1];
            if (bVar4 != 0x6e) goto LAB_001237c0;
            bVar4 = pbVar2[2];
            if (bVar4 != 99) goto LAB_001237c6;
            bVar4 = pbVar2[3];
            if (bVar4 != 0x6c) goto LAB_001237cc;
            bVar4 = pbVar2[4];
            if (bVar4 != 0x75) goto LAB_001237d2;
            bVar4 = pbVar2[5];
            if (bVar4 != 100) goto LAB_001237d8;
            bVar4 = pbVar2[6];
            if (bVar4 != 0x65) goto LAB_001237de;
            pbVar3 = pbVar2 + 7;
            if ((""[pbVar2[7]] & 0x40) == 0) {
              bVar1 = true;
              unaff_EBX = INCLUDE;
              goto LAB_00123835;
            }
          }
        }
        else if (bVar4 < 0x73) {
          if (bVar4 == 0x70) {
            bVar4 = pbVar2[1];
            if (bVar4 != 0x6f) goto LAB_001237c0;
            bVar4 = pbVar2[2];
            if (bVar4 != 0x6f) goto LAB_001237c6;
            bVar4 = pbVar2[3];
            if (bVar4 != 0x6c) goto LAB_001237cc;
            pbVar3 = pbVar2 + 4;
            if ((""[pbVar2[4]] & 0x40) == 0) {
              bVar1 = true;
              unaff_EBX = POOL;
              goto LAB_00123835;
            }
          }
          else if (bVar4 == 0x72) {
            bVar4 = pbVar2[1];
            if (bVar4 != 0x75) goto LAB_001237c0;
            bVar4 = pbVar2[2];
            if (bVar4 != 0x6c) goto LAB_001237c6;
            bVar4 = pbVar2[3];
            if (bVar4 != 0x65) goto LAB_001237cc;
            pbVar3 = pbVar2 + 4;
            if ((""[pbVar2[4]] & 0x40) == 0) {
              bVar1 = true;
              unaff_EBX = RULE;
              goto LAB_00123835;
            }
          }
        }
        else {
          if (0x7a < bVar4) {
            if (bVar4 == 0x7c) {
              pbVar3 = pbVar2 + 1;
              if (pbVar2[1] == 0x7c) {
                pbVar3 = pbVar2 + 2;
              }
              unaff_EBX = (pbVar2[1] == 0x7c) + PIPE;
              goto LAB_00123832;
            }
            goto LAB_001236f2;
          }
          if (bVar4 == 0x73) {
            bVar4 = pbVar2[1];
            if (bVar4 != 0x75) goto LAB_001237c0;
            bVar4 = pbVar2[2];
            if (bVar4 != 0x62) goto LAB_001237c6;
            bVar4 = pbVar2[3];
            if (bVar4 != 0x6e) goto LAB_001237cc;
            bVar4 = pbVar2[4];
            if (bVar4 != 0x69) goto LAB_001237d2;
            bVar4 = pbVar2[5];
            if (bVar4 != 0x6e) goto LAB_001237d8;
            bVar4 = pbVar2[6];
            if (bVar4 != 0x6a) goto LAB_001237de;
            bVar4 = pbVar2[7];
            if (bVar4 != 0x61) {
              pbVar3 = pbVar2 + 7;
              goto LAB_001237f1;
            }
            pbVar3 = pbVar2 + 8;
            if ((""[pbVar2[8]] & 0x40) == 0) {
              bVar1 = true;
              unaff_EBX = SUBNINJA;
              goto LAB_00123835;
            }
          }
        }
LAB_001237ea:
        do {
          bVar4 = pbVar3[1];
          pbVar3 = pbVar3 + 1;
LAB_001237f1:
        } while ((""[bVar4] & 0x40) != 0);
        bVar1 = true;
        unaff_EBX = IDENT;
      }
    }
LAB_00123835:
    if (bVar1) {
      this->last_token_ = (char *)pbVar2;
      this->ofs_ = (char *)pbVar3;
      if ((unaff_EBX != NEWLINE) && (unaff_EBX != TEOF)) {
        EatWhitespace(this);
      }
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

Lexer::Token Lexer::ReadToken() {
  const char* p = ofs_;
  const char* q;
  const char* start;
  Lexer::Token token;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	unsigned int yyaccept = 0;
	static const unsigned char yybm[] = {
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128,   0, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		160, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 192, 192, 128, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 128, 128, 128, 128, 128, 128, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 192, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
	};
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '^') {
		if (yych <= ',') {
			if (yych <= '\f') {
				if (yych <= 0x00) goto yy2;
				if (yych == '\n') goto yy6;
				goto yy4;
			} else {
				if (yych <= '\r') goto yy8;
				if (yych == '#') goto yy12;
				goto yy4;
			}
		} else {
			if (yych <= ':') {
				if (yych == '/') goto yy4;
				if (yych <= '9') goto yy13;
				goto yy16;
			} else {
				if (yych <= '=') {
					if (yych <= '<') goto yy4;
					goto yy18;
				} else {
					if (yych <= '@') goto yy4;
					if (yych <= 'Z') goto yy13;
					goto yy4;
				}
			}
		}
	} else {
		if (yych <= 'i') {
			if (yych <= 'b') {
				if (yych == '`') goto yy4;
				if (yych <= 'a') goto yy13;
				goto yy20;
			} else {
				if (yych == 'd') goto yy21;
				if (yych <= 'h') goto yy13;
				goto yy22;
			}
		} else {
			if (yych <= 'r') {
				if (yych == 'p') goto yy23;
				if (yych <= 'q') goto yy13;
				goto yy24;
			} else {
				if (yych <= 'z') {
					if (yych <= 's') goto yy25;
					goto yy13;
				} else {
					if (yych == '|') goto yy26;
					goto yy4;
				}
			}
		}
	}
yy2:
	++p;
	{ token = TEOF;     break; }
yy4:
	++p;
yy5:
	{ token = ERROR;    break; }
yy6:
	++p;
	{ token = NEWLINE;  break; }
yy8:
	yych = *++p;
	if (yych == '\n') goto yy28;
	goto yy5;
yy9:
	yyaccept = 0;
	q = ++p;
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '\f') {
		if (yych == '\n') goto yy6;
	} else {
		if (yych <= '\r') goto yy30;
		if (yych == '#') goto yy32;
	}
yy11:
	{ token = INDENT;   break; }
yy12:
	yyaccept = 1;
	yych = *(q = ++p);
	if (yych <= 0x00) goto yy5;
	goto yy33;
yy13:
	++p;
	yych = *p;
yy14:
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = IDENT;    break; }
yy16:
	++p;
	{ token = COLON;    break; }
yy18:
	++p;
	{ token = EQUALS;   break; }
yy20:
	yych = *++p;
	if (yych == 'u') goto yy36;
	goto yy14;
yy21:
	yych = *++p;
	if (yych == 'e') goto yy37;
	goto yy14;
yy22:
	yych = *++p;
	if (yych == 'n') goto yy38;
	goto yy14;
yy23:
	yych = *++p;
	if (yych == 'o') goto yy39;
	goto yy14;
yy24:
	yych = *++p;
	if (yych == 'u') goto yy40;
	goto yy14;
yy25:
	yych = *++p;
	if (yych == 'u') goto yy41;
	goto yy14;
yy26:
	++p;
	if ((yych = *p) == '|') goto yy42;
	{ token = PIPE;     break; }
yy28:
	++p;
	{ token = NEWLINE;  break; }
yy30:
	yych = *++p;
	if (yych == '\n') goto yy28;
yy31:
	p = q;
	if (yyaccept == 0) {
		goto yy11;
	} else {
		goto yy5;
	}
yy32:
	++p;
	yych = *p;
yy33:
	if (yybm[0+yych] & 128) {
		goto yy32;
	}
	if (yych <= 0x00) goto yy31;
	++p;
	{ continue; }
yy36:
	yych = *++p;
	if (yych == 'i') goto yy44;
	goto yy14;
yy37:
	yych = *++p;
	if (yych == 'f') goto yy45;
	goto yy14;
yy38:
	yych = *++p;
	if (yych == 'c') goto yy46;
	goto yy14;
yy39:
	yych = *++p;
	if (yych == 'o') goto yy47;
	goto yy14;
yy40:
	yych = *++p;
	if (yych == 'l') goto yy48;
	goto yy14;
yy41:
	yych = *++p;
	if (yych == 'b') goto yy49;
	goto yy14;
yy42:
	++p;
	{ token = PIPE2;    break; }
yy44:
	yych = *++p;
	if (yych == 'l') goto yy50;
	goto yy14;
yy45:
	yych = *++p;
	if (yych == 'a') goto yy51;
	goto yy14;
yy46:
	yych = *++p;
	if (yych == 'l') goto yy52;
	goto yy14;
yy47:
	yych = *++p;
	if (yych == 'l') goto yy53;
	goto yy14;
yy48:
	yych = *++p;
	if (yych == 'e') goto yy55;
	goto yy14;
yy49:
	yych = *++p;
	if (yych == 'n') goto yy57;
	goto yy14;
yy50:
	yych = *++p;
	if (yych == 'd') goto yy58;
	goto yy14;
yy51:
	yych = *++p;
	if (yych == 'u') goto yy60;
	goto yy14;
yy52:
	yych = *++p;
	if (yych == 'u') goto yy61;
	goto yy14;
yy53:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = POOL;     break; }
yy55:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = RULE;     break; }
yy57:
	yych = *++p;
	if (yych == 'i') goto yy62;
	goto yy14;
yy58:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = BUILD;    break; }
yy60:
	yych = *++p;
	if (yych == 'l') goto yy63;
	goto yy14;
yy61:
	yych = *++p;
	if (yych == 'd') goto yy64;
	goto yy14;
yy62:
	yych = *++p;
	if (yych == 'n') goto yy65;
	goto yy14;
yy63:
	yych = *++p;
	if (yych == 't') goto yy66;
	goto yy14;
yy64:
	yych = *++p;
	if (yych == 'e') goto yy68;
	goto yy14;
yy65:
	yych = *++p;
	if (yych == 'j') goto yy70;
	goto yy14;
yy66:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = DEFAULT;  break; }
yy68:
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = INCLUDE;  break; }
yy70:
	yych = *++p;
	if (yych != 'a') goto yy14;
	++p;
	if (yybm[0+(yych = *p)] & 64) {
		goto yy13;
	}
	{ token = SUBNINJA; break; }
}

  }

  last_token_ = start;
  ofs_ = p;
  if (token != NEWLINE && token != TEOF)
    EatWhitespace();
  return token;
}